

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::appendLinearJoint(btSoftBody *this,Specs *specs,Cluster *body0,Body body1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  Joint **ptr;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Joint *__s;
  btTransform *pbVar9;
  Joint **ppJVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float local_64;
  float local_60;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_48;
  float local_40;
  
  __s = (Joint *)btAlignedAllocInternal(0xd8,0x10);
  memset(__s,0,0xd8);
  __s->m_bodies[0].m_soft = (Cluster *)0x0;
  __s->m_bodies[0].m_rigid = (btRigidBody *)0x0;
  __s->m_bodies[0].m_collisionObject = (btCollisionObject *)0x0;
  __s->m_bodies[1].m_soft = (Cluster *)0x0;
  __s->m_bodies[1].m_rigid = (btRigidBody *)0x0;
  __s->m_bodies[1].m_collisionObject = (btCollisionObject *)0x0;
  __s->m_delete = false;
  __s->_vptr_Joint = (_func_int **)&PTR__Joint_00229390;
  __s->m_bodies[0].m_soft = body0;
  __s->m_bodies[0].m_rigid = (btRigidBody *)0x0;
  __s->m_bodies[0].m_collisionObject = (btCollisionObject *)0x0;
  __s->m_bodies[1].m_collisionObject = body1.m_collisionObject;
  __s->m_bodies[1].m_soft = body1.m_soft;
  __s->m_bodies[1].m_rigid = body1.m_rigid;
  pbVar9 = Body::xform(__s->m_bodies);
  btTransform::inverse(pbVar9);
  fVar1 = (specs->position).m_floats[0];
  fVar2 = (specs->position).m_floats[1];
  fVar3 = (specs->position).m_floats[2];
  fVar14 = (float)((ulong)local_48 >> 0x20);
  auVar7._4_4_ = fVar14 + local_60 * fVar3 + local_68 * fVar1 + local_64 * fVar2;
  auVar7._0_4_ = (float)local_48 + fStack_70 * fVar3 + local_78 * fVar1 + fStack_74 * fVar2;
  auVar7._8_4_ = local_50 * fVar3 + local_58 * fVar1 + local_54 * fVar2 + local_40;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])__s->m_refs[0].m_floats = auVar7;
  pbVar9 = Body::xform(__s->m_bodies + 1);
  btTransform::inverse(pbVar9);
  fVar1 = (specs->position).m_floats[0];
  fVar2 = (specs->position).m_floats[1];
  fVar3 = (specs->position).m_floats[2];
  auVar8._4_4_ = fVar14 + local_60 * fVar3 + local_68 * fVar1 + local_64 * fVar2;
  auVar8._0_4_ = (float)local_48 + fStack_70 * fVar3 + local_78 * fVar1 + fStack_74 * fVar2;
  auVar8._8_4_ = local_50 * fVar3 + local_58 * fVar1 + local_54 * fVar2 + local_40;
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])__s->m_refs[1].m_floats = auVar8;
  uVar4 = *(undefined8 *)specs;
  __s->m_cfm = (btScalar)(int)((ulong)uVar4 >> 0x20);
  __s->m_erp = (btScalar)(int)uVar4;
  __s->m_split = *(btScalar *)&specs->field_0x8;
  iVar5 = (this->m_joints).m_size;
  iVar6 = (this->m_joints).m_capacity;
  if (iVar5 == iVar6) {
    iVar13 = 1;
    if (iVar5 != 0) {
      iVar13 = iVar5 * 2;
    }
    if (iVar6 < iVar13) {
      if (iVar13 == 0) {
        ppJVar10 = (Joint **)0x0;
      }
      else {
        ppJVar10 = (Joint **)btAlignedAllocInternal((long)iVar13 << 3,0x10);
      }
      lVar11 = (long)(this->m_joints).m_size;
      if (0 < lVar11) {
        lVar12 = 0;
        do {
          ppJVar10[lVar12] = (this->m_joints).m_data[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar11 != lVar12);
      }
      ptr = (this->m_joints).m_data;
      if (ptr != (Joint **)0x0) {
        if ((this->m_joints).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_joints).m_data = (Joint **)0x0;
      }
      (this->m_joints).m_ownsMemory = true;
      (this->m_joints).m_data = ppJVar10;
      (this->m_joints).m_capacity = iVar13;
    }
  }
  iVar5 = (this->m_joints).m_size;
  (this->m_joints).m_data[iVar5] = __s;
  (this->m_joints).m_size = iVar5 + 1;
  return;
}

Assistant:

void			btSoftBody::appendLinearJoint(const LJoint::Specs& specs,Cluster* body0,Body body1)
{
	LJoint*		pj	=	new(btAlignedAlloc(sizeof(LJoint),16)) LJoint();
	pj->m_bodies[0]	=	body0;
	pj->m_bodies[1]	=	body1;
	pj->m_refs[0]	=	pj->m_bodies[0].xform().inverse()*specs.position;
	pj->m_refs[1]	=	pj->m_bodies[1].xform().inverse()*specs.position;
	pj->m_cfm		=	specs.cfm;
	pj->m_erp		=	specs.erp;
	pj->m_split		=	specs.split;
	m_joints.push_back(pj);
}